

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O1

bool tinyusdz::io::SplitUDIMPath(string *path,string *pre,string *post)

{
  pointer pcVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  bool bVar4;
  string tag;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"<UDIM>","");
  pcVar1 = (path->_M_dataplus)._M_p;
  _Var2 = ::std::
          __search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    (pcVar1,pcVar1 + path->_M_string_length,local_50,local_48 + (long)local_50);
  if (_Var2._M_current == (path->_M_dataplus)._M_p + path->_M_string_length) {
    bVar4 = false;
  }
  else {
    _Var3 = ::std::
            __find_end<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      ();
    bVar4 = false;
    if ((_Var2._M_current == _Var3._M_current) &&
       (pcVar1 = (path->_M_dataplus)._M_p, bVar4 = false,
       _Var3._M_current != pcVar1 + path->_M_string_length)) {
      if (pre != (string *)0x0) {
        local_70[0] = local_60;
        ::std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)local_70,pcVar1,_Var2._M_current);
        ::std::__cxx11::string::operator=((string *)pre,(string *)local_70);
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
      }
      bVar4 = true;
      if (post != (string *)0x0) {
        local_70[0] = local_60;
        ::std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)local_70,_Var3._M_current,
                   (path->_M_dataplus)._M_p + path->_M_string_length);
        ::std::__cxx11::string::operator=((string *)post,(string *)local_70);
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
      }
    }
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return bVar4;
}

Assistant:

bool SplitUDIMPath(const std::string &path, std::string *pre,
                   std::string *post) {
  std::string tag = "<UDIM>";

  auto rs = std::search(path.begin(), path.end(), tag.begin(), tag.end());
  if (rs == path.end()) {
    return false;
  }

  auto re = std::find_end(path.begin(), path.end(), tag.begin(), tag.end());
  if (re == path.end()) {
    return false;
  }

  // No multiple tags. e.g. diffuse.<UDIM>.<UDIM>.png
  if (rs != re) {
    return false;
  }

  if (pre) {
    (*pre) = std::string(path.begin(), rs);
  }

  if (post) {
    (*post) = std::string(re, path.end());
  }

  return true;
}